

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LangevinDynamics.cpp
# Opt level: O1

void __thiscall OpenMD::LangevinDynamics::moveA(LangevinDynamics *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  Snapshot *pSVar4;
  DataStoragePointer DVar5;
  RotationAlgorithm *pRVar6;
  long lVar7;
  uint i_1;
  Molecule *pMVar8;
  long lVar9;
  double *pdVar10;
  uint i_8;
  Vector3d *pVVar11;
  pointer ppSVar12;
  StuntDouble *this_00;
  Vector<double,_3U> result;
  Vector3d vel;
  Vector3d ji;
  Vector3d pos;
  MoleculeIterator i;
  Vector3d Tb;
  Vector3d frc;
  Vector3d local_108;
  double local_e8 [4];
  double local_c8 [4];
  double local_a8 [3];
  MoleculeIterator local_90;
  double local_88 [4];
  double local_68 [4];
  Vector3d local_48;
  
  local_90._M_node = (_Base_ptr)0x0;
  local_e8[2] = 0.0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_a8[2] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_68[2] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_88[2] = 0.0;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_c8[2] = 0.0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  pMVar8 = SimInfo::beginMolecule
                     ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_90);
  if (pMVar8 != (Molecule *)0x0) {
    do {
      ppSVar12 = (pMVar8->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar12 ==
          (pMVar8->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_00 = (StuntDouble *)0x0;
      }
      else {
        this_00 = *ppSVar12;
      }
      while (this_00 != (StuntDouble *)0x0) {
        pSVar4 = this_00->snapshotMan_->currentSnapshot_;
        lVar9 = *(long *)((long)&(pSVar4->atomData).velocity.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + this_00->storage_);
        lVar7 = (long)this_00->localIndex_ * 0x18;
        local_e8[2] = (double)*(undefined8 *)(lVar9 + 0x10 + lVar7);
        pdVar10 = (double *)(lVar9 + lVar7);
        local_e8[0] = *pdVar10;
        local_e8[1] = pdVar10[1];
        lVar9 = *(long *)((long)&(pSVar4->atomData).position.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + this_00->storage_);
        local_a8[2] = (double)*(undefined8 *)(lVar9 + 0x10 + lVar7);
        pdVar10 = (double *)(lVar9 + lVar7);
        local_a8[0] = *pdVar10;
        local_a8[1] = pdVar10[1];
        lVar9 = *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).force.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + this_00->storage_);
        local_68[2] = (double)*(undefined8 *)(lVar9 + 0x10 + (long)this_00->localIndex_ * 0x18);
        pdVar10 = (double *)(lVar9 + (long)this_00->localIndex_ * 0x18);
        local_68[0] = *pdVar10;
        local_68[1] = pdVar10[1];
        dVar1 = (this->super_VelocityVerletIntegrator).super_Integrator.dt2;
        dVar2 = this_00->mass_;
        local_108.super_Vector<double,_3U>.data_[0] = 0.0;
        local_108.super_Vector<double,_3U>.data_[1] = 0.0;
        local_108.super_Vector<double,_3U>.data_[2] = 0.0;
        lVar9 = 0;
        do {
          local_108.super_Vector<double,_3U>.data_[lVar9] =
               local_68[lVar9] * (dVar1 / dVar2) * 0.0004184;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        lVar9 = 0;
        do {
          local_e8[lVar9] = local_108.super_Vector<double,_3U>.data_[lVar9] + local_e8[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        dVar1 = (this->super_VelocityVerletIntegrator).super_Integrator.dt;
        local_108.super_Vector<double,_3U>.data_[0] = 0.0;
        local_108.super_Vector<double,_3U>.data_[1] = 0.0;
        local_108.super_Vector<double,_3U>.data_[2] = 0.0;
        lVar9 = 0;
        do {
          local_108.super_Vector<double,_3U>.data_[lVar9] = local_e8[lVar9] * dVar1;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        lVar9 = 0;
        do {
          local_a8[lVar9] = local_108.super_Vector<double,_3U>.data_[lVar9] + local_a8[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        DVar5 = this_00->storage_;
        pSVar4 = this_00->snapshotMan_->currentSnapshot_;
        iVar3 = this_00->localIndex_;
        lVar9 = *(long *)((long)&(pSVar4->atomData).velocity.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + DVar5);
        lVar7 = (long)iVar3 * 0x18;
        *(double *)(lVar9 + 0x10 + lVar7) = local_e8[2];
        pdVar10 = (double *)(lVar9 + lVar7);
        *pdVar10 = local_e8[0];
        pdVar10[1] = local_e8[1];
        lVar9 = *(long *)((long)&(pSVar4->atomData).position.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + DVar5);
        *(double *)(lVar9 + 0x10 + lVar7) = local_a8[2];
        pdVar10 = (double *)(lVar9 + lVar7);
        *pdVar10 = local_a8[0];
        pdVar10[1] = local_a8[1];
        if (this_00->objType_ - otDAtom < 2) {
          pVVar11 = (Vector3d *)
                    ((long)iVar3 * 0x18 +
                    *(long *)((long)&(pSVar4->atomData).torque.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + this_00->storage_))
          ;
          local_48.super_Vector<double,_3U>.data_[0] = 0.0;
          local_48.super_Vector<double,_3U>.data_[1] = 0.0;
          local_48.super_Vector<double,_3U>.data_[2] = 0.0;
          if (pVVar11 != &local_48) {
            lVar9 = 0;
            do {
              local_48.super_Vector<double,_3U>.data_[lVar9] =
                   (pVVar11->super_Vector<double,_3U>).data_[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
          }
          StuntDouble::lab2Body(&local_108,this_00,&local_48);
          local_88[2] = local_108.super_Vector<double,_3U>.data_[2];
          local_88[0] = local_108.super_Vector<double,_3U>.data_[0];
          local_88[1] = local_108.super_Vector<double,_3U>.data_[1];
          lVar9 = *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).
                                   angularMomentum.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + this_00->storage_);
          pdVar10 = (double *)(lVar9 + (long)this_00->localIndex_ * 0x18);
          local_c8[2] = (double)*(undefined8 *)(lVar9 + 0x10 + (long)this_00->localIndex_ * 0x18);
          local_c8[0] = *pdVar10;
          local_c8[1] = pdVar10[1];
          dVar1 = (this->super_VelocityVerletIntegrator).super_Integrator.dt2;
          local_108.super_Vector<double,_3U>.data_[0] = 0.0;
          local_108.super_Vector<double,_3U>.data_[1] = 0.0;
          local_108.super_Vector<double,_3U>.data_[2] = 0.0;
          lVar9 = 0;
          do {
            local_108.super_Vector<double,_3U>.data_[lVar9] = local_88[lVar9] * dVar1 * 0.0004184;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          lVar9 = 0;
          do {
            local_c8[lVar9] = local_108.super_Vector<double,_3U>.data_[lVar9] + local_c8[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          pRVar6 = (this->super_VelocityVerletIntegrator).super_Integrator.rotAlgo_;
          (*pRVar6->_vptr_RotationAlgorithm[2])
                    (SUB84((this->super_VelocityVerletIntegrator).super_Integrator.dt,0),pRVar6,
                     this_00,local_c8);
          pdVar10 = (double *)
                    ((long)this_00->localIndex_ * 0x18 +
                    *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).
                                     angularMomentum.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + this_00->storage_))
          ;
          if (pdVar10 != local_c8) {
            lVar9 = 0;
            do {
              pdVar10[lVar9] = local_c8[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
          }
        }
        ppSVar12 = ppSVar12 + 1;
        if (ppSVar12 ==
            (pMVar8->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          this_00 = (StuntDouble *)0x0;
        }
        else {
          this_00 = *ppSVar12;
        }
      }
      pMVar8 = SimInfo::nextMolecule
                         ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_90);
    } while (pMVar8 != (Molecule *)0x0);
  }
  (*((this->super_VelocityVerletIntegrator).super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[4])();
  Rattle::constraintA((this->super_VelocityVerletIntegrator).super_Integrator.rattle_);
  return;
}

Assistant:

void LangevinDynamics::moveA() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d vel;
    Vector3d pos;
    Vector3d frc;
    Vector3d Tb;
    Vector3d ji;
    RealType mass;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        vel  = sd->getVel();
        pos  = sd->getPos();
        frc  = sd->getFrc();
        mass = sd->getMass();

        // velocity half step
        vel += (dt2 / mass * Constants::energyConvert) * frc;

        // position whole step
        pos += dt * vel;

        sd->setVel(vel);
        sd->setPos(pos);

        if (sd->isDirectional()) {
          // get and convert the torque to body frame

          Tb = sd->lab2Body(sd->getTrq());

          // get the angular momentum, and propagate a half step

          ji = sd->getJ();

          ji += (dt2 * Constants::energyConvert) * Tb;

          rotAlgo_->rotate(sd, ji, dt);

          sd->setJ(ji);
        }
      }
    }  // end for(mol = info_->beginMolecule(i))

    flucQ_->moveA();
    rattle_->constraintA();
  }